

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O3

int32_t icu_63::number::impl::AffixUtils::estimateLength
                  (UnicodeString *patternString,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  int32_t offset;
  
  sVar1 = (patternString->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (patternString->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 < 1) {
    iVar4 = 0;
  }
  else {
    uVar5 = 0;
    iVar4 = 0;
    offset = 0;
    do {
      uVar2 = UnicodeString::char32At(patternString,offset);
      switch(uVar5) {
      case 0:
        uVar5 = (uint)(uVar2 == 0x27);
        iVar4 = iVar4 + (uint)(uVar2 != 0x27);
        break;
      case 1:
        iVar4 = iVar4 + 1;
        uVar5 = (uint)(uVar2 != 0x27) * 2;
        break;
      case 2:
        uVar5 = (uint)(uVar2 != 0x27);
        iVar4 = iVar4 + uVar5;
        goto LAB_002591d5;
      case 3:
        uVar5 = (uint)(uVar2 == 0x27);
        iVar4 = iVar4 + 1;
LAB_002591d5:
        uVar5 = uVar5 ^ 3;
      }
      sVar1 = (patternString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (patternString->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      offset = (offset - (uint)(uVar2 < 0x10000)) + 2;
    } while (offset < iVar3);
    if (uVar5 - 1 < 2) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return iVar4;
}

Assistant:

int32_t AffixUtils::estimateLength(const UnicodeString &patternString, UErrorCode &status) {
    AffixPatternState state = STATE_BASE;
    int32_t offset = 0;
    int32_t length = 0;
    for (; offset < patternString.length();) {
        UChar32 cp = patternString.char32At(offset);

        switch (state) {
            case STATE_BASE:
                if (cp == u'\'') {
                    // First quote
                    state = STATE_FIRST_QUOTE;
                } else {
                    // Unquoted symbol
                    length++;
                }
                break;
            case STATE_FIRST_QUOTE:
                if (cp == u'\'') {
                    // Repeated quote
                    length++;
                    state = STATE_BASE;
                } else {
                    // Quoted code point
                    length++;
                    state = STATE_INSIDE_QUOTE;
                }
                break;
            case STATE_INSIDE_QUOTE:
                if (cp == u'\'') {
                    // End of quoted sequence
                    state = STATE_AFTER_QUOTE;
                } else {
                    // Quoted code point
                    length++;
                }
                break;
            case STATE_AFTER_QUOTE:
                if (cp == u'\'') {
                    // Double quote inside of quoted sequence
                    length++;
                    state = STATE_INSIDE_QUOTE;
                } else {
                    // Unquoted symbol
                    length++;
                }
                break;
            default:
                U_ASSERT(false);
        }

        offset += U16_LENGTH(cp);
    }

    switch (state) {
        case STATE_FIRST_QUOTE:
        case STATE_INSIDE_QUOTE:
            status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
        default:
            break;
    }

    return length;
}